

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Break::gen(Break *this,int b,int a)

{
  ostream *this_00;
  element_type *peVar1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  int local_18;
  int local_14;
  int a_local;
  int b_local;
  Break *this_local;
  
  local_18 = a;
  local_14 = b;
  _a_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,"goto L");
  peVar1 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->stmt);
  std::ostream::operator<<(this_00,*(int *)&(peVar1->super_Node).field_0xc);
  std::__cxx11::stringstream::str();
  Node::emit((Node *)this,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::stringstream ss;
		ss << "goto L" << stmt->after;
		emit(ss.str());
	}